

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O2

void __thiscall
flow::diagnostics::Report::syntaxError<flow::lang::Token,flow::lang::Token>
          (Report *this,SourceLocation *sloc,string *f,Token args,Token args_1)

{
  Token *in_R9;
  string_view format_str;
  Token args_local_1;
  Token args_local;
  string local_78;
  SourceLocation local_58;
  
  args_local_1 = args_1;
  args_local = args;
  SourceLocation::SourceLocation(&local_58,sloc);
  format_str.size_ = (size_t)&args_local;
  format_str.data_ = (char *)f->_M_string_length;
  fmt::v5::format<flow::lang::Token,flow::lang::Token>
            (&local_78,(v5 *)(f->_M_dataplus)._M_p,format_str,&args_local_1,in_R9);
  emplace_back(this,SyntaxError,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void syntaxError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::SyntaxError, sloc, fmt::format(f, std::move(args)...));
  }